

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

HighsStatus __thiscall Highs::handleInfCost(Highs *this)

{
  HighsModel *this_00;
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  iterator __position;
  iterator iVar3;
  bool bVar4;
  long lVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  char *format;
  int iVar7;
  int iVar8;
  double dVar9;
  double upper;
  double lower;
  double cost;
  uint local_9c;
  double local_98;
  double local_90;
  HighsLogOptions *local_88;
  double local_80;
  vector<double,std::allocator<double>> *local_78;
  vector<double,std::allocator<double>> *local_70;
  vector<double,std::allocator<double>> *local_68;
  vector<int,std::allocator<int>> *local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  if ((this->model_).lp_.has_infinite_cost_ == true) {
    this_00 = &this->model_;
    local_48 = (this->options_).super_HighsOptionsStruct.infinite_cost;
    uStack_40 = 0;
    local_58 = -local_48;
    uStack_50 = 0x8000000000000000;
    pvVar1 = &(this->model_).lp_.col_lower_;
    pvVar2 = &(this->model_).lp_.col_upper_;
    local_88 = &(this->options_).super_HighsOptionsStruct.log_options;
    local_60 = (vector<int,std::allocator<int>> *)
               &(this->model_).lp_.mods_.save_inf_cost_variable_index;
    local_68 = (vector<double,std::allocator<double>> *)
               &(this->model_).lp_.mods_.save_inf_cost_variable_cost;
    local_70 = (vector<double,std::allocator<double>> *)
               &(this->model_).lp_.mods_.save_inf_cost_variable_lower;
    local_78 = (vector<double,std::allocator<double>> *)
               &(this->model_).lp_.mods_.save_inf_cost_variable_upper;
    iVar7 = 0;
    do {
      local_9c = 0;
      if (0 < (this_00->lp_).num_col_) {
        do {
          lVar5 = (long)(int)local_9c;
          local_80 = (this->model_).lp_.col_cost_.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar5];
          if ((local_80 <= local_58) || (iVar8 = 7, local_48 <= local_80)) {
            local_90 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar5];
            local_98 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar5];
            bVar4 = HighsLp::isMip(&this_00->lp_);
            if ((bVar4) &&
               ((this->model_).lp_.integrality_.
                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                super__Vector_impl_data._M_start[(int)local_9c] == kInteger)) {
              local_90 = ceil(local_90);
              local_98 = floor(local_98);
            }
            pvVar6 = pvVar1;
            dVar9 = local_98;
            if (local_80 <= local_58) {
              if ((this->model_).lp_.sense_ == kMinimize) {
                if (local_98 != INFINITY) goto LAB_00237bae;
                format = "Cannot minimize with a cost on variable %d of %g and upper bound of %g\n";
              }
              else {
                pvVar6 = pvVar2;
                dVar9 = local_90;
                if (local_90 != -INFINITY) goto LAB_00237bae;
                format = "Cannot maximize with a cost on variable %d of %g and lower bound of %g\n";
              }
            }
            else if ((this->model_).lp_.sense_ == kMinimize) {
              pvVar6 = pvVar2;
              dVar9 = local_90;
              if (local_90 != -INFINITY) {
LAB_00237bae:
                iVar8 = 0;
                if ((iVar7 != 0) &&
                   ((pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[(int)local_9c] = dVar9, iVar7 != 0)) {
                  __position._M_current =
                       *(pointer *)
                        ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_index.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data + 8);
                  if (__position._M_current ==
                      *(pointer *)
                       ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_index.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + 0x10)) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              (local_60,__position,(int *)&local_9c);
                  }
                  else {
                    *__position._M_current = local_9c;
                    *(int **)((long)&(this->model_).lp_.mods_.save_inf_cost_variable_index.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data + 8) = __position._M_current + 1;
                  }
                  iVar3._M_current =
                       *(pointer *)
                        ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_cost.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data + 8);
                  if (iVar3._M_current ==
                      *(pointer *)
                       ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_cost.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data + 0x10)) {
                    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                              (local_68,iVar3,&local_80);
                  }
                  else {
                    *iVar3._M_current = local_80;
                    *(double **)
                     ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_cost.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data + 8) = iVar3._M_current + 1;
                  }
                  iVar3._M_current =
                       *(pointer *)
                        ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_lower.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data + 8);
                  if (iVar3._M_current ==
                      *(pointer *)
                       ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_lower.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data + 0x10)) {
                    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                              (local_70,iVar3,&local_90);
                  }
                  else {
                    *iVar3._M_current = local_90;
                    *(double **)
                     ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_lower.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data + 8) = iVar3._M_current + 1;
                  }
                  iVar3._M_current =
                       *(pointer *)
                        ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_upper.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data + 8);
                  if (iVar3._M_current ==
                      *(pointer *)
                       ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_upper.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data + 0x10)) {
                    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                              (local_78,iVar3,&local_98);
                  }
                  else {
                    *iVar3._M_current = local_98;
                    *(double **)
                     ((long)&(this->model_).lp_.mods_.save_inf_cost_variable_upper.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data + 8) = iVar3._M_current + 1;
                  }
                  (this->model_).lp_.col_cost_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[(int)local_9c] = 0.0;
                }
                goto LAB_00237cf6;
              }
              format = "Cannot minimize with a cost on variable %d of %g and lower bound of %g\n";
            }
            else {
              if (local_98 != INFINITY) goto LAB_00237bae;
              format = "Cannot maximize with a cost on variable %d of %g and upper bound of %g\n";
            }
            highsLogUser(local_88,kError,format,(ulong)local_9c);
            iVar8 = 1;
          }
LAB_00237cf6:
          if ((iVar8 != 7) && (iVar8 != 0)) {
            return kError;
          }
          local_9c = local_9c + 1;
        } while ((int)local_9c < (this_00->lp_).num_col_);
      }
      bVar4 = iVar7 == 0;
      iVar7 = iVar7 + 1;
    } while (bVar4);
    (this->model_).lp_.has_infinite_cost_ = false;
  }
  return kOk;
}

Assistant:

HighsStatus Highs::handleInfCost() {
  HighsLp& lp = this->model_.lp_;
  if (!lp.has_infinite_cost_) return HighsStatus::kOk;
  HighsLpMods& mods = lp.mods_;
  double inf_cost = this->options_.infinite_cost;
  for (HighsInt k = 0; k < 2; k++) {
    // Pass twice: first checking that infinite costs can be handled,
    // then handling them, so that model is unmodified if infinite
    // costs cannot be handled
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      double cost = lp.col_cost_[iCol];
      if (cost > -inf_cost && cost < inf_cost) continue;
      double lower = lp.col_lower_[iCol];
      double upper = lp.col_upper_[iCol];
      if (lp.isMip()) {
        if (lp.integrality_[iCol] == HighsVarType::kInteger) {
          lower = std::ceil(lower);
          upper = std::floor(upper);
        }
      }
      if (cost <= -inf_cost) {
        if (lp.sense_ == ObjSense::kMinimize) {
          // Minimizing with -inf cost so try to fix at upper bound
          if (upper < kHighsInf) {
            if (k) lp.col_lower_[iCol] = upper;
          } else {
            highsLogUser(options_.log_options, HighsLogType::kError,
                         "Cannot minimize with a cost on variable %d of %g and "
                         "upper bound of %g\n",
                         int(iCol), cost, upper);
            return HighsStatus::kError;
          }
        } else {
          // Maximizing with -inf cost so try to fix at lower bound
          if (lower > -kHighsInf) {
            if (k) lp.col_upper_[iCol] = lower;
          } else {
            highsLogUser(options_.log_options, HighsLogType::kError,
                         "Cannot maximize with a cost on variable %d of %g and "
                         "lower bound of %g\n",
                         int(iCol), cost, lower);
            return HighsStatus::kError;
          }
        }
      } else {
        if (lp.sense_ == ObjSense::kMinimize) {
          // Minimizing with inf cost so try to fix at lower bound
          if (lower > -kHighsInf) {
            if (k) lp.col_upper_[iCol] = lower;
          } else {
            highsLogUser(options_.log_options, HighsLogType::kError,
                         "Cannot minimize with a cost on variable %d of %g and "
                         "lower bound of %g\n",
                         int(iCol), cost, lower);
            return HighsStatus::kError;
          }
        } else {
          // Maximizing with inf cost so try to fix at upper bound
          if (upper < kHighsInf) {
            if (k) lp.col_lower_[iCol] = upper;
          } else {
            highsLogUser(options_.log_options, HighsLogType::kError,
                         "Cannot maximize with a cost on variable %d of %g and "
                         "upper bound of %g\n",
                         int(iCol), cost, upper);
            return HighsStatus::kError;
          }
        }
      }
      if (k) {
        mods.save_inf_cost_variable_index.push_back(iCol);
        mods.save_inf_cost_variable_cost.push_back(cost);
        mods.save_inf_cost_variable_lower.push_back(lower);
        mods.save_inf_cost_variable_upper.push_back(upper);
        lp.col_cost_[iCol] = 0;
      }
    }
  }
  // Infinite costs have been removed, but their presence in the
  // original model is known from mods.save_inf_cost_variable_*, so
  // set lp.has_infinite_cost_ to be false to avoid assert when run()
  // is called using copy of model in MIP solver (See #1446)
  lp.has_infinite_cost_ = false;

  return HighsStatus::kOk;
}